

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

Matrix3d *
Util::ECEF2ECI(Matrix3d *__return_storage_ptr__,double JD_UTC,MatrixXd *nut80ptr,
              MatrixXd *iau1980ptr,
              vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *matvecptr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  long lVar10;
  Matrix3d *pMVar11;
  Matrix3d *pMVar12;
  long lVar13;
  byte bVar14;
  double __x;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double __x_00;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  initializer_list<int> __l;
  double local_528;
  double dStack_520;
  vector<int,_std::allocator<int>_> order;
  _Vector_base<int,_std::allocator<int>_> local_468;
  _Vector_base<int,_std::allocator<int>_> local_450;
  _Vector_base<int,_std::allocator<int>_> local_438;
  Vector3d local_420;
  _Vector_base<int,_std::allocator<int>_> local_408;
  Matrix3d horror;
  undefined1 local_358 [16];
  double local_348;
  undefined1 local_338 [16];
  double local_328;
  Vector3d local_318;
  Matrix3d N;
  Matrix3d S;
  Matrix3d W;
  Matrix3d P;
  Matrix3d local_1e0;
  Matrix3d local_198;
  Matrix3d local_150;
  Matrix3d local_108;
  Matrix3d local_c0;
  Matrix3d local_78;
  
  bVar14 = 0;
  __x = JD_UTC + -2400000.5;
  __x_00 = (__x + 0.00042824074074074075 + 0.00037249999999999995 + -51544.5) / 36525.0;
  dVar15 = floor(__x);
  pdVar9 = (iau1980ptr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar13 = (iau1980ptr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
  dVar16 = floor(__x - *pdVar9);
  lVar10 = (long)(int)dVar16;
  dVar16 = pdVar9[lVar13 + lVar10];
  dVar25 = pdVar9[lVar13 + lVar10 + 1];
  dVar26 = pdVar9[lVar13 * 2 + lVar10];
  dVar28 = pdVar9[lVar13 * 2 + lVar10 + 1];
  dVar1 = pdVar9[lVar13 * 3 + lVar10];
  dVar2 = pdVar9[lVar13 * 3 + lVar10 + 1];
  dVar3 = pdVar9[lVar13 * 4 + lVar10];
  dVar4 = pdVar9[lVar13 * 4 + lVar10 + 1];
  dVar29 = __x_00 * __x_00;
  dVar17 = pow(__x_00,3.0);
  dVar18 = pow(__x_00,3.0);
  dVar19 = pow(__x_00,3.0);
  P.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       4.24399158341274e-314;
  P.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]._0_4_ = 3
  ;
  __l._M_len = 3;
  __l._M_array = (iterator)&P;
  std::vector<int,_std::allocator<int>_>::vector(&order,__l,(allocator_type *)&N);
  auVar30._0_8_ = (dVar19 * 0.018203 + __x_00 * 2306.2181 + dVar29 * 1.09468) * 3.141592653589793;
  auVar30._8_8_ = (dVar18 * -0.041833 + __x_00 * 2004.3109 + dVar29 * -0.42665) * 3.141592653589793;
  local_338 = divpd(auVar30,_DAT_00131c60);
  local_328 = ((dVar17 * 0.017998 + __x_00 * 2306.2181 + dVar29 * 0.30188) * 3.141592653589793) /
              648000.0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_408,&order);
  Angle2RotM(&P,(Vector3d *)local_338,(vector<int,_std::allocator<int>_> *)&local_408);
  dVar15 = __x - dVar15;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_408);
  dVar17 = pow(__x_00,3.0);
  dVar18 = pow(__x_00,3.0);
  dVar19 = pow(__x_00,3.0);
  dVar20 = pow(__x_00,3.0);
  dVar21 = pow(__x_00,3.0);
  dVar22 = pow(__x_00,3.0);
  dVar22 = ((dVar22 * 2.2e-06 + dVar29 * 0.0020708 + __x_00 * -1934.1362608 + 125.04452222) *
           3.141592653589793) / 180.0;
  local_528 = 0.0;
  dStack_520 = 0.0;
  for (lVar13 = 0; lVar13 != 0x350; lVar13 = lVar13 + 8) {
    pdVar9 = (nut80ptr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar10 = (nut80ptr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows;
    dVar5 = *(double *)((long)pdVar9 + lVar10 * 0x40 + lVar13);
    dVar6 = *(double *)((long)pdVar9 + lVar10 * 0x30 + lVar13);
    dVar23 = *(double *)((long)pdVar9 + lVar10 * 0x20 + lVar13) * dVar22 +
             *(double *)((long)pdVar9 + lVar10 * 0x18 + lVar13) *
             (((dVar21 * 5.299999999999999e-06 +
               dVar29 * -0.0019142 + __x_00 * 445267.11148 + 297.85036306) * 3.141592653589793) /
             180.0) + *(double *)((long)pdVar9 + lVar10 * 0x10 + lVar13) *
                      (((dVar20 * 3.1e-06 +
                        dVar29 * -0.0036825 + __x_00 * 483202.0175381 + 93.27191028) *
                       3.141592653589793) / 180.0) +
                      *(double *)((long)pdVar9 + lVar13) *
                      (((dVar18 * 1.7800000000000002e-05 +
                        dVar29 * 0.0086972 + __x_00 * 477198.8673981 + 134.96298139) *
                       3.141592653589793) / 180.0) +
                      *(double *)((long)pdVar9 + lVar10 * 8 + lVar13) *
                      (((dVar19 * -3.2999999999999997e-06 +
                        dVar29 * -0.0001603 + __x_00 * 35999.05034 + 357.52772333) *
                       3.141592653589793) / 180.0);
    dVar7 = *(double *)((long)pdVar9 + lVar10 * 0x38 + lVar13);
    dVar8 = *(double *)((long)pdVar9 + lVar10 * 0x28 + lVar13);
    dVar24 = sin(dVar23);
    dVar23 = cos(dVar23);
    local_528 = local_528 + dVar23 * (dVar5 * __x_00 + dVar7);
    dStack_520 = dStack_520 + dVar24 * (dVar6 * __x_00 + dVar8);
  }
  N.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       6.36598737338988e-314;
  N.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]._0_4_ = 1
  ;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&order,&N);
  dVar17 = ((dVar17 * 0.001813 + dVar29 * -0.00059 + __x_00 * -46.815 + 84381.448) *
           3.141592653589793) / 648000.0;
  dVar18 = (dStack_520 * 0.0001 * 3.141592653589793) / 648000.0;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (local_528 * 0.0001 * 3.141592653589793) / 648000.0 + dVar17;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       -dVar17;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       dVar18;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_438,&order);
  Angle2RotM(&N,&local_420,(vector<int,_std::allocator<int>_> *)&local_438);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_438);
  W.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       2.1219957919534e-314;
  W.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]._0_4_ = 3
  ;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&order,&W);
  auVar27._0_8_ = (dVar15 * (dVar25 - dVar16) + dVar16) * 3.141592653589793;
  auVar27._8_8_ = (dVar15 * (dVar28 - dVar26) + dVar26) * 3.141592653589793;
  local_358 = divpd(auVar27,_DAT_00131c70);
  local_348 = 0.0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_450,&order);
  Angle2RotM(&W,(Vector3d *)local_358,(vector<int,_std::allocator<int>_> *)&local_450);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_450);
  dVar16 = cos(dVar17);
  dVar25 = sin(dVar22);
  dVar26 = sin(dVar22 + dVar22);
  S.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       2.12199579244747e-314;
  S.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]._0_4_ = 3
  ;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&order,&S);
  dVar28 = __x + ((dVar2 - dVar1) * dVar15 + dVar1) / 86400.0 + -51544.5;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       -(dVar18 * dVar16 + ((dVar25 * 0.00264 + dVar26 * 6.3e-05) * 3.141592653589793) / 648000.0 +
        ((dVar28 * -9.253097568194336e-24 + 5.0752099941135916e-15) * dVar28 + 6.300388098984894) *
        dVar28 + 4.894961212823059);
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_468,&order);
  Angle2RotM(&S,&local_318,(vector<int,_std::allocator<int>_> *)&local_468);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_468);
  pMVar11 = &P;
  pMVar12 = &local_78;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    pMVar12 = (Matrix3d *)((long)pMVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  OrthoNormMat(&horror,&local_78);
  lVar13 = 9;
  pMVar11 = &horror;
  pMVar12 = &P;
  for (lVar10 = lVar13; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    pMVar12 = (Matrix3d *)((long)pMVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pMVar11 = &N;
  pMVar12 = &local_c0;
  for (; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    pMVar12 = (Matrix3d *)((long)pMVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  OrthoNormMat(&horror,&local_c0);
  lVar13 = 9;
  pMVar11 = &horror;
  pMVar12 = &N;
  for (lVar10 = lVar13; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    pMVar12 = (Matrix3d *)((long)pMVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pMVar11 = &S;
  pMVar12 = &local_108;
  for (; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    pMVar12 = (Matrix3d *)((long)pMVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  OrthoNormMat(&horror,&local_108);
  lVar13 = 9;
  pMVar11 = &horror;
  pMVar12 = &S;
  for (lVar10 = lVar13; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    pMVar12 = (Matrix3d *)((long)pMVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pMVar11 = &W;
  pMVar12 = &local_150;
  for (; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    pMVar12 = (Matrix3d *)((long)pMVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  OrthoNormMat(&horror,&local_150);
  pMVar11 = &horror;
  pMVar12 = &W;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    pMVar12 = (Matrix3d *)((long)pMVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            ((matvecptr->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&P);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            ((matvecptr->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,&N);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            ((matvecptr->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2,&S);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            ((matvecptr->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 3,&W);
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&horror,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&local_1e0);
  horror.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       dVar15 * (dVar4 - dVar3) + dVar3;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::push_back(matvecptr,&horror);
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&P;
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&N;
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&S;
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       (double)&W;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)__return_storage_ptr__,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_1e0);
  pMVar11 = __return_storage_ptr__;
  pMVar12 = &local_198;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    pMVar12 = (Matrix3d *)((long)pMVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  OrthoNormMat(&local_1e0,&local_198);
  pMVar11 = &local_1e0;
  pMVar12 = __return_storage_ptr__;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    pMVar12 = (Matrix3d *)((long)pMVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&order.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d ECEF2ECI(double JD_UTC, Eigen::MatrixXd* nut80ptr, Eigen::MatrixXd* iau1980ptr, std::vector<Eigen::Matrix3d>* matvecptr){

		//********* deal with time ******************

		//J2000 time
		double J2000 = 2451545.0;

		//offset to get mean julian dates
		double MJD_offset = 2400000.5;

		//mean julian date, J2000
		double MJD_J2000 = J2000 - MJD_offset;

		//current mean JD
		double MJD_UTC = JD_UTC - MJD_offset;

		double MJD_TAI = MJD_UTC + 37.0/(3600.0*24.0);
		double MJD_TT = MJD_TAI + 32.184/(3600.0*24.0);

		// find the change in time since J2000.0 (T_TT)
		double tsinceJ2000 = (MJD_TT - MJD_J2000)/36525.0;

		//find the remainder in the current JD
		double JD_UTC_rem = MJD_UTC - floor(MJD_UTC);

		// std::cout << "MJD_J2000: " << MJD_J2000 << "\n";
		// std::cout << "MJD_UTC: " << MJD_UTC << "\n";
		// std::cout << "MJD_TAI: " << MJD_TAI << "\n";
		// std::cout << "MJD_TT: " << MJD_TT << "\n";
		// std::cout << "JD_UTC_rem: " << JD_UTC_rem << "\n";

		//we will manually find values from iau1980.txt because lazy
		// std::cout << "You need to manually find this in iau1980.txt \n";
		// std::cout << "floor(MJD_UTC): " << floor(MJD_UTC) << "\n";
		// exit(0);

		//manual search found this:
		// 1712 1 58088.00 I  0.124136 0.000022  0.236728 0.000035  I 0.2485001 0.0000084  1.5396 0.0061  I  -104.226    0.322    -8.561    0.160  0.124126  0.236687  0.2485227  -104.524    -8.685  
		// 1712 2 58089.00 I  0.121708 0.000026  0.236266 0.000028  I 0.2469699 0.0000084  1.4837 0.0058  I  -104.143    0.322    -8.430    0.160  0.121669  0.236396  0.2469833  -105.014    -8.516
		// double PMx1 = 0.124126;
		// double PMx2 = 0.121669;
		// double PMy1 = 0.236687;
		// double PMy2 = 0.236396;
		// double UT1_UTC1 = 0.24852270;
		// double UT1_UTC2 = 0.24698330;

		//get initial index of desired time
		int tidx = floor(MJD_UTC - iau1980ptr->coeff(0,0));

		// std::cout << "located at index: " << tidx << "\n";

		//extract values
		double PMx1 = iau1980ptr->coeff(tidx,1);
		double PMx2 = iau1980ptr->coeff(tidx+1,1);
		double PMy1 = iau1980ptr->coeff(tidx,2);
		double PMy2 = iau1980ptr->coeff(tidx+1,2);
		double UT1_UTC1 = iau1980ptr->coeff(tidx,3);
		double UT1_UTC2 = iau1980ptr->coeff(tidx+1,3);
		double LOD1 = iau1980ptr->coeff(tidx,4);
		double LOD2 = iau1980ptr->coeff(tidx+1,4);

		//******** find rotation from precession ******************

		//now, find the three angles in degrees
		double zeta_deg = 2306.2181*tsinceJ2000 + 0.30188*pow(tsinceJ2000,2) + 0.017998*pow(tsinceJ2000,3); 
		double theta_deg = 2004.3109*tsinceJ2000 - 0.42665*pow(tsinceJ2000,2) - 0.041833*pow(tsinceJ2000,3); 
		double z_deg = 2306.2181*tsinceJ2000 + 1.09468*pow(tsinceJ2000,2) + 0.018203*pow(tsinceJ2000,3);

		//convert angles to radians
		double zeta = zeta_deg*M_PI/(3600.0*180.0);
		double theta = theta_deg*M_PI/(3600.0*180.0);
		double z = z_deg*M_PI/(3600.0*180.0);

		// std::cout << "tsinceJ2000: " << tsinceJ2000 << "\n";
		// std::cout << "zeta: " << zeta << "\n";
		// std::cout << "theta: " << theta << "\n";
		// std::cout << "z: " << z << "\n";

		//create matrix
		Eigen::Vector3d angles(z,-theta,zeta);
		std::vector<int> order = {3,2,3};
		Eigen::Matrix3d P = Angle2RotM(angles, order);

		//******** find rotation from nutation ******************

		// load the parameters
		// Eigen::MatrixXd nut80 = LoadDatFile("../data/nut80.csv", 106, 10);

		//find epsbar1980
		double epsbar1980 = (84381.448 - 46.8150*tsinceJ2000 - 0.00059*pow(tsinceJ2000,2) + 0.001813*pow(tsinceJ2000,3))*M_PI/(3600.0*180.0);

		//find values from 3-82 (corrected according to errata)
		double r = 360.0;
		double M_moon = 134.96298139 + (1325.0*r + 198.8673981)*tsinceJ2000 + 0.0086972*pow(tsinceJ2000,2) + 1.78*pow(10.0,-5)*pow(tsinceJ2000,3);
		double M_cirle = 357.52772333 + (99.0*r + 359.0503400)*tsinceJ2000 - 0.0001603*pow(tsinceJ2000,2) - 3.3*pow(10.0,-6)*pow(tsinceJ2000,3);
		double uM_moon =  93.27191028 + (1342.0*r + 82.0175381)*tsinceJ2000 - 0.0036825*pow(tsinceJ2000,2) + 3.1*pow(10.0,-6)*pow(tsinceJ2000,3);
		double D_circle = 297.85036306 + (1236.0*r + 307.1114800)*tsinceJ2000 - 0.0019142*pow(tsinceJ2000,2) + 5.3*pow(10.0,-6)*pow(tsinceJ2000,3);
		double Ohm_moon = 125.04452222 - (5.0*r + 134.1362608)*tsinceJ2000 +  0.0020708*pow(tsinceJ2000,2) + 2.2*pow(10.0,-6)*pow(tsinceJ2000,3);

		//convert to radians
		M_moon = M_moon*M_PI/180.0;
		M_cirle = M_cirle*M_PI/180.0;
		uM_moon = uM_moon*M_PI/180.0;
		D_circle = D_circle*M_PI/180.0;
		Ohm_moon = Ohm_moon*M_PI/180.0;

		// std::cout << "M_moon: " << M_moon << "\n";
		// std::cout << "M_cirle: " << M_cirle << "\n";
		// std::cout << "uM_moon: " << uM_moon << "\n";
		// std::cout << "D_circle: " << D_circle << "\n";
		// std::cout << "Ohm_moon: " << Ohm_moon << "\n";

		// exit(0);

		//sum
		double deltaPsi_1980 = 0.0;
		double deltaEsp_1980 = 0.0;
		for (int ii = 0; ii < 106; ++ii) {

			//extract locals
			double an1 = nut80ptr->coeff(ii,0);
			double an2 = nut80ptr->coeff(ii,1);
			double an3 = nut80ptr->coeff(ii,2);
			double an4 = nut80ptr->coeff(ii,3);
			double an5 = nut80ptr->coeff(ii,4);
			double A = nut80ptr->coeff(ii,5);
			double B = nut80ptr->coeff(ii,6);
			double C = nut80ptr->coeff(ii,7);
			double D = nut80ptr->coeff(ii,8);
			double idx = nut80ptr->coeff(ii,9);

			//aPi
			double aPi = an1*M_moon + an2*M_cirle + an3*uM_moon + an4*D_circle + an5*Ohm_moon;

			//sums
			deltaPsi_1980 = deltaPsi_1980 + (A + B*tsinceJ2000)*sin(aPi);
			deltaEsp_1980 = deltaEsp_1980 + (C + D*tsinceJ2000)*cos(aPi);
		}

		//convert sums to radians
		deltaPsi_1980 = deltaPsi_1980*pow(10.0,-4)*M_PI/(3600.0*180.0);
		deltaEsp_1980 = deltaEsp_1980*pow(10.0,-4)*M_PI/(3600.0*180.0);

		// std::cout << "deltaPsi_1980: " << deltaPsi_1980 << "\n";
		// std::cout << "deltaEsp_1980: " << deltaEsp_1980 << "\n";

		//rotation
		order = {1,3,1};
		angles[0] = epsbar1980 + deltaEsp_1980;
		angles[1] = deltaPsi_1980;
		angles[2] = -epsbar1980;
		Eigen::Matrix3d N = Angle2RotM(angles,order);

		// std::cout << "angles: " << angles << "\n";

		//******** find rotation from Polar Motion ******************

		//interpolate these two values based on iau1980.txt
		double xp = PMx1 + JD_UTC_rem*(PMx2 - PMx1);
		double yp = PMy1 + JD_UTC_rem*(PMy2 - PMy1);

		//convert to radians
		xp = xp*M_PI/(3600.0*180.0);
		yp = yp*M_PI/(3600.0*180.0);

		//rotation
		order = {2,1,3};
		angles[0] = xp;
		angles[1] = yp;
		angles[2] = 0.0;
		Eigen::Matrix3d W = Angle2RotM(angles,order);

		//******** find rotation from Earth Rotation ******************

		//interpolate change in UTC
		double dUTC = UT1_UTC1 + JD_UTC_rem*(UT1_UTC2 - UT1_UTC1);

		//correct modified julian date
		double MJD_UT1 = MJD_UTC + dUTC/(24.0*3600.0);

		//change in time
		double dT = MJD_UT1 - MJD_J2000;

		//Greenwich mean sidereal time (from tapley shuctz born)
		double theta_GMST = 4.894961212823058751375704430 + dT*(6.300388098984893552276513720 + dT*(5.075209994113591478053805523*pow(10.0,-15) - 9.253097568194335640067190688*pow(10.0,-24)*dT));
		// double theta_GMST2 = 4.894961212823058751375704430 + (6.3003880989848935522776513720 + (5.07520999411359147805523e-15 - 9.253097568194335640067190688e-24*dT)*dT)*dT;

		// std::cout << "one: " << theta_GMST << "\n two: " << theta_GMST2;
		
		//now we get some other crazy value
		double Eqequinox1982 = deltaPsi_1980*cos(epsbar1980) + (0.00264*sin(Ohm_moon) + 0.000063*sin(2*Ohm_moon))*M_PI/(3600.0*180.0);

		//find theta
		double theta_GAST = theta_GMST + Eqequinox1982;

		//rotation
		order = {3,1,3};
		angles[0] = -theta_GAST;
		angles[1] = 0.0;
		angles[2] = 0.0;
		Eigen::Matrix3d S = Angle2RotM(angles,order);

		// std::cout << "JD_UTC_rem: " << JD_UTC_rem << "\n";
		// std::cout << "dUTC: " << dUTC << "\n";
		// std::cout << "UT1_UTC1: " << UT1_UTC1 << "\n";
		// std::cout << "UT1_UTC2: " << UT1_UTC2 << "\n";

		//enforce orthonormalization
		P = OrthoNormMat(P);
		N = OrthoNormMat(N);
		S = OrthoNormMat(S);
		W = OrthoNormMat(W);

		// //write out all the matricies
		// std::cout << "P:\n" << P << "\n";
		// std::cout << "N:\n" << N << "\n";
		// std::cout << "S:\n" << S << "\n";
		// std::cout << "W:\n" << W << "\n";

		//write each matrix to the vector
		(*matvecptr)[0] = P;
		(*matvecptr)[1] = N;
		(*matvecptr)[2] = S;
		(*matvecptr)[3] = W;

		//do something horrific and insert the LOD value into a new element of the matvecptr
		Eigen::Matrix3d horror = Eigen::Matrix3d::Zero(3,3);
		horror(0,0) = LOD1 + JD_UTC_rem*(LOD2 - LOD1);
		matvecptr->push_back(horror);

		//Matrix
		Eigen::Matrix3d Rotm = P*N*S*W;
		Rotm = OrthoNormMat(Rotm);

		//output
		return Rotm;

	}